

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O1

void MatrixMultiply(Matrix m1,Matrix m2,Matrix prod)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  if (((*(char *)((long)m1 + -6) == *(char *)((long)m2 + -7)) &&
      (*(char *)((long)prod + -7) == *(char *)((long)m1 + -7))) &&
     (*(char *)((long)prod + -6) == *(char *)((long)m2 + -6))) {
    if (*(char *)((long)m1 + -7) != '\0') {
      uVar2 = 0;
      do {
        if (*(char *)((long)m2 + -6) != '\0') {
          pdVar1 = prod[uVar2];
          uVar3 = 0;
          do {
            if ((ulong)*(byte *)((long)m1 + -6) == 0) {
              dVar5 = 0.0;
            }
            else {
              dVar5 = 0.0;
              uVar4 = 0;
              do {
                dVar5 = dVar5 + m1[uVar2][uVar4] * m2[uVar4][uVar3];
                uVar4 = uVar4 + 1;
              } while (*(byte *)((long)m1 + -6) != uVar4);
            }
            pdVar1[uVar3] = dVar5;
            uVar3 = uVar3 + 1;
          } while (uVar3 < *(byte *)((long)m2 + -6));
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < *(byte *)((long)m1 + -7));
    }
    return;
  }
  Am_Error("MatrixMultiply");
}

Assistant:

void
MatrixMultiply(Matrix m1, Matrix m2, Matrix prod)
{
  int i, j, k;
  double sum;

  if (NCOLS(m1) != NROWS(m2))
    Am_Error("MatrixMultiply"); //: Can't multiply %dx%d and %dx%d matrices",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2));
  if (NROWS(prod) != NROWS(m1) || NCOLS(prod) != NCOLS(m2))
    Am_Error(
        "MatrixMultiply"); //: %dx%d times %dx%d does not give %dx%d product",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2),
  //NROWS(prod), NCOLS(prod));

  for (i = 0; i < NROWS(m1); i++)
    for (j = 0; j < NCOLS(m2); j++) {
      sum = 0;
      for (k = 0; k < NCOLS(m1); k++)
        sum += m1[i][k] * m2[k][j];
      prod[i][j] = sum;
    }
}